

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb::BitpackingFetchRow<unsigned_int>
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  uint uVar1;
  data_ptr_t pdVar2;
  int iVar3;
  unsigned_long skip_count;
  uint multiplier;
  BitpackingScanState<unsigned_int,_int> scan_state;
  uint32_t local_207c;
  BitpackingScanState<unsigned_int,_int> local_2078;
  
  BitpackingScanState<unsigned_int,_int>::BitpackingScanState(&local_2078,segment);
  skip_count = NumericCastImpl<unsigned_long,_long,_false>::Convert(row_id);
  BitpackingScanState<unsigned_int,_int>::Skip(&local_2078,segment,skip_count);
  pdVar2 = result->data;
  if (local_2078.current_group.mode == CONSTANT_DELTA) {
    TryCast::Operation<unsigned_long,unsigned_int>
              (local_2078.current_group_offset,&local_207c,false);
    local_2078.current_constant =
         local_2078.current_constant * local_207c + local_2078.current_frame_of_reference;
  }
  else if (local_2078.current_group.mode != CONSTANT) {
    duckdb_fastpforlib::fastunpack
              ((uint32_t *)
               (local_2078.current_group_ptr +
               ((ulong)local_2078.current_width *
                (local_2078.current_group_offset & 0xffffffffffffffe0) >> 3)),
               local_2078.decompression_buffer,(uint)local_2078.current_width);
    uVar1 = local_2078.decompression_buffer[(uint)local_2078.current_group_offset & 0x1f];
    *(uint *)(pdVar2 + result_idx * 4) = uVar1;
    iVar3 = uVar1 + local_2078.current_frame_of_reference;
    *(int *)(pdVar2 + result_idx * 4) = iVar3;
    if (local_2078.current_group.mode != DELTA_FOR) goto LAB_0059f11d;
    local_2078.current_constant = iVar3 + local_2078.current_delta_offset;
  }
  *(uint *)(pdVar2 + result_idx * 4) = local_2078.current_constant;
LAB_0059f11d:
  local_2078.super_SegmentScanState._vptr_SegmentScanState =
       (_func_int **)&PTR__BitpackingScanState_01976630;
  BufferHandle::~BufferHandle(&local_2078.handle);
  return;
}

Assistant:

void BitpackingFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result,
                        idx_t result_idx) {
	BitpackingScanState<T> scan_state(segment);
	scan_state.Skip(segment, NumericCast<idx_t>(row_id));

	D_ASSERT(scan_state.current_group_offset < BITPACKING_METADATA_GROUP_SIZE);

	D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
	T *result_data = FlatVector::GetData<T>(result);
	T *current_result_ptr = result_data + result_idx;

	idx_t offset_in_compression_group =
	    scan_state.current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

	data_ptr_t decompression_group_start_pointer =
	    scan_state.current_group_ptr +
	    (scan_state.current_group_offset - offset_in_compression_group) * scan_state.current_width / 8;

	//! Because FOR offsets all our values to be 0 or above, we can always skip sign extension here
	bool skip_sign_extend = true;

	if (scan_state.current_group.mode == BitpackingMode::CONSTANT) {
		*current_result_ptr = scan_state.current_constant;
		return;
	}

	if (scan_state.current_group.mode == BitpackingMode::CONSTANT_DELTA) {
		T multiplier;
		auto cast = TryCast::Operation<idx_t, T>(scan_state.current_group_offset, multiplier);
		(void)cast;
		D_ASSERT(cast);
#ifdef DEBUG
		// overflow check
		T result;
		bool multiply = TryMultiplyOperator::Operation(multiplier, scan_state.current_constant, result);
		bool add = TryAddOperator::Operation(result, scan_state.current_frame_of_reference, result);
		D_ASSERT(multiply && add);
#endif
		*current_result_ptr = (multiplier * scan_state.current_constant) + scan_state.current_frame_of_reference;
		return;
	}

	D_ASSERT(scan_state.current_group.mode == BitpackingMode::FOR ||
	         scan_state.current_group.mode == BitpackingMode::DELTA_FOR);

	BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(scan_state.decompression_buffer),
	                                     decompression_group_start_pointer, scan_state.current_width, skip_sign_extend);

	*current_result_ptr = scan_state.decompression_buffer[offset_in_compression_group];
	*current_result_ptr += scan_state.current_frame_of_reference;

	if (scan_state.current_group.mode == BitpackingMode::DELTA_FOR) {
		*current_result_ptr += scan_state.current_delta_offset;
	}
}